

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O0

void sep_upsample(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION *in_row_group_ctr,
                 JDIMENSION in_row_groups_avail,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
                 JDIMENSION out_rows_avail)

{
  long lVar1;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  uint *in_R9;
  uint in_stack_00000008;
  JDIMENSION num_rows;
  jpeg_component_info *compptr;
  int ci;
  my_upsample_ptr upsample;
  undefined4 local_4c;
  undefined8 local_48;
  undefined4 local_3c;
  
  lVar1 = *(long *)(in_RDI + 0x260);
  if (*(int *)(in_RDI + 0x19c) <= *(int *)(lVar1 + 0xb8)) {
    local_3c = 0;
    local_48 = *(long *)(in_RDI + 0x130);
    for (; local_3c < *(int *)(in_RDI + 0x38); local_3c = local_3c + 1) {
      (**(code **)(lVar1 + 0x68 + (long)local_3c * 8))
                (in_RDI,local_48,
                 *(long *)(in_RSI + (long)local_3c * 8) +
                 (ulong)(uint)(*in_RDX * *(int *)(lVar1 + 0xc0 + (long)local_3c * 4)) * 8,
                 lVar1 + 0x18 + (long)local_3c * 8);
      local_48 = local_48 + 0x60;
    }
    *(undefined4 *)(lVar1 + 0xb8) = 0;
  }
  local_4c = *(int *)(in_RDI + 0x19c) - *(int *)(lVar1 + 0xb8);
  if (*(uint *)(lVar1 + 0xbc) < local_4c) {
    local_4c = *(uint *)(lVar1 + 0xbc);
  }
  in_stack_00000008 = in_stack_00000008 - *in_R9;
  if (in_stack_00000008 < local_4c) {
    local_4c = in_stack_00000008;
  }
  (**(code **)(*(long *)(in_RDI + 0x268) + 8))
            (in_RDI,lVar1 + 0x18,*(undefined4 *)(lVar1 + 0xb8),in_R8 + (ulong)*in_R9 * 8,local_4c);
  *in_R9 = local_4c + *in_R9;
  *(uint *)(lVar1 + 0xbc) = *(int *)(lVar1 + 0xbc) - local_4c;
  *(uint *)(lVar1 + 0xb8) = local_4c + *(int *)(lVar1 + 0xb8);
  if (*(int *)(in_RDI + 0x19c) <= *(int *)(lVar1 + 0xb8)) {
    *in_RDX = *in_RDX + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
sep_upsample(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
             JDIMENSION *in_row_group_ctr, JDIMENSION in_row_groups_avail,
             JSAMPARRAY output_buf, JDIMENSION *out_row_ctr,
             JDIMENSION out_rows_avail)
{
  my_upsample_ptr upsample = (my_upsample_ptr)cinfo->upsample;
  int ci;
  jpeg_component_info *compptr;
  JDIMENSION num_rows;

  /* Fill the conversion buffer, if it's empty */
  if (upsample->next_row_out >= cinfo->max_v_samp_factor) {
    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
         ci++, compptr++) {
      /* Invoke per-component upsample method.  Notice we pass a POINTER
       * to color_buf[ci], so that fullsize_upsample can change it.
       */
      (*upsample->methods[ci]) (cinfo, compptr,
        input_buf[ci] + (*in_row_group_ctr * upsample->rowgroup_height[ci]),
        upsample->color_buf + ci);
    }
    upsample->next_row_out = 0;
  }

  /* Color-convert and emit rows */

  /* How many we have in the buffer: */
  num_rows = (JDIMENSION)(cinfo->max_v_samp_factor - upsample->next_row_out);
  /* Not more than the distance to the end of the image.  Need this test
   * in case the image height is not a multiple of max_v_samp_factor:
   */
  if (num_rows > upsample->rows_to_go)
    num_rows = upsample->rows_to_go;
  /* And not more than what the client can accept: */
  out_rows_avail -= *out_row_ctr;
  if (num_rows > out_rows_avail)
    num_rows = out_rows_avail;

  (*cinfo->cconvert->color_convert) (cinfo, upsample->color_buf,
                                     (JDIMENSION)upsample->next_row_out,
                                     output_buf + *out_row_ctr, (int)num_rows);

  /* Adjust counts */
  *out_row_ctr += num_rows;
  upsample->rows_to_go -= num_rows;
  upsample->next_row_out += num_rows;
  /* When the buffer is emptied, declare this input row group consumed */
  if (upsample->next_row_out >= cinfo->max_v_samp_factor)
    (*in_row_group_ctr)++;
}